

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long in_RDI;
  double dVar7;
  int index_1;
  int col_1;
  int row_1;
  int col_offset_y;
  int row_offset_y;
  buf_2d buf;
  int mi_col;
  int mi_row;
  int index;
  double num_of_var;
  double var;
  int col;
  int row;
  double log_sum;
  int num_rows;
  int num_cols;
  int num_mi_h;
  int num_mi_w;
  int block_size;
  int y_stride;
  uint8_t *y_buffer;
  MACROBLOCKD *xd;
  CommonModeInfoParams *mi_params;
  int in_stack_ffffffffffffff58;
  BLOCK_SIZE in_stack_ffffffffffffff5f;
  undefined2 in_stack_ffffffffffffff60;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int iVar9;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar10;
  int local_64;
  int local_60;
  double local_58;
  double local_50;
  int local_48;
  int local_44;
  double local_40;
  
  iVar3 = (*(int *)(in_RDI + 0x3c198) + 3) / 4;
  iVar4 = (*(int *)(in_RDI + 0x3c194) + 3) / 4;
  local_40 = 0.0;
  for (local_44 = 0; local_44 < iVar4; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
      local_50 = 0.0;
      local_58 = 0.0;
      for (local_60 = local_44 << 2; bVar2 = local_60 < *(int *)(in_RDI + 0x3c194),
          bVar1 = local_60 < (local_44 + 1) * 4, uVar8 = bVar2 && bVar1, bVar2 && bVar1;
          local_60 = local_60 + 2) {
        for (local_64 = local_48 << 2; bVar2 = local_64 < *(int *)(in_RDI + 0x3c198),
            bVar1 = local_64 < (local_48 + 1) * 4, bVar2 && bVar1; local_64 = local_64 + 2) {
          uVar5 = av1_get_perpixel_variance_facade
                            ((AV1_COMP *)CONCAT44(local_60 * 4,local_64 << 2),
                             (MACROBLOCKD *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             (buf_2d *)
                             CONCAT44(in_stack_ffffffffffffff64,
                                      CONCAT13(uVar8,CONCAT12(bVar2 && bVar1,
                                                              in_stack_ffffffffffffff60))),
                             in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58);
          local_50 = (double)uVar5 + local_50;
          local_58 = local_58 + 1.0;
        }
      }
      dVar7 = exp((local_50 / local_58) * -0.0021489);
      dVar7 = (1.0 - dVar7) * 67.035434 + 17.492222;
      *(double *)(*(long *)(in_RDI + 0x9d328) + (long)(local_44 * iVar3 + local_48) * 8) = dVar7;
      dVar7 = log(dVar7);
      local_40 = dVar7 + local_40;
    }
  }
  dVar7 = exp(local_40 / (double)(iVar4 * iVar3));
  for (iVar10 = 0; iVar10 < iVar4; iVar10 = iVar10 + 1) {
    for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
      lVar6 = (long)(iVar10 * iVar3 + iVar9);
      *(double *)(*(long *)(in_RDI + 0x9d328) + lVar6 * 8) =
           *(double *)(*(long *)(in_RDI + 0x9d328) + lVar6 * 8) / dVar7;
    }
  }
  return;
}

Assistant:

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = BLOCK_16X16;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;
  double log_sum = 0.0;

  // Loop through each 16x16 block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          var += av1_get_perpixel_variance_facade(cpi, xd, &buf, BLOCK_8X8,
                                                  AOM_PLANE_Y);
          num_of_var += 1.0;
        }
      }
      var = var / num_of_var;

      // Curve fitting with an exponential model on all 16x16 blocks from the
      // midres dataset.
      var = 67.035434 * (1 - exp(-0.0021489 * var)) + 17.492222;

      // As per the above computation, var will be in the range of
      // [17.492222, 84.527656], assuming the data type is of infinite
      // precision. The following assert conservatively checks if var is in the
      // range of [17.0, 85.0] to avoid any issues due to the precision of the
      // relevant data type.
      assert(var > 17.0 && var < 85.0);
      cpi->ssim_rdmult_scaling_factors[index] = var;
      log_sum += log(var);
    }
  }

  // As log_sum holds the geometric mean, it will be in the range
  // [17.492222, 84.527656]. Hence, in the below loop, the value of
  // cpi->ssim_rdmult_scaling_factors[index] would be in the range
  // [0.2069, 4.8323].
  log_sum = exp(log_sum / (double)(num_rows * num_cols));

  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      cpi->ssim_rdmult_scaling_factors[index] /= log_sum;
    }
  }
}